

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getDualViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *maxviol,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *sumviol)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  undefined8 in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  VarStatus rowStatus;
  int r;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *dual;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffae8;
  int n;
  undefined4 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf4;
  undefined1 in_stack_fffffffffffffaf5;
  undefined1 in_stack_fffffffffffffaf6;
  undefined1 in_stack_fffffffffffffaf7;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffaf8;
  type_conflict5 local_4f9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb10;
  undefined1 local_470 [112];
  double in_stack_fffffffffffffc00;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffc08;
  undefined1 local_3f0 [128];
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined1 local_358 [128];
  undefined1 local_2d8 [128];
  undefined1 local_258 [128];
  undefined8 local_1d8;
  VarStatus local_1d0;
  int local_1cc;
  undefined8 local_1c8;
  undefined8 local_1c0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  undefined8 local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  bool local_191;
  undefined1 *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  undefined1 *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined8 *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_89;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_1b0 = in_RDX;
  local_1a8 = in_RSI;
  bVar1 = hasBasis(in_RDI);
  if (bVar1) {
    _syncRealSolution((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_fffffffffffffaf7,
                                  CONCAT16(in_stack_fffffffffffffaf6,
                                           CONCAT15(in_stack_fffffffffffffaf5,
                                                    CONCAT14(in_stack_fffffffffffffaf4,
                                                             in_stack_fffffffffffffaf0)))));
    local_1b8 = &(in_RDI->_solReal)._dual;
    local_1c0 = 0;
    local_130 = local_1a8;
    local_138 = &local_1c0;
    local_128 = local_138;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    local_1c8 = 0;
    local_148 = local_1b0;
    local_150 = &local_1c8;
    local_140 = local_150;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    local_1cc = numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x7b5fd7);
    while (local_1cc = local_1cc + -1, -1 < local_1cc) {
      local_1d0 = basisRowStatus(in_stack_fffffffffffffaf8,
                                 CONCAT13(in_stack_fffffffffffffaf7,
                                          CONCAT12(in_stack_fffffffffffffaf6,
                                                   CONCAT11(in_stack_fffffffffffffaf5,
                                                            in_stack_fffffffffffffaf4))));
      iVar3 = intParam(in_RDI,OBJSENSE);
      n = (int)((ulong)in_stack_fffffffffffffae8 >> 0x20);
      if (iVar3 == -1) {
        local_4f9 = false;
        if ((local_1d0 != ON_UPPER) && (local_4f9 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffaf7,
                                   CONCAT16(in_stack_fffffffffffffaf6,
                                            CONCAT15(in_stack_fffffffffffffaf5,
                                                     CONCAT14(in_stack_fffffffffffffaf4,
                                                              in_stack_fffffffffffffaf0)))),n);
          local_1d8 = 0;
          local_4f9 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_fffffffffffffae8,(double *)0x7b606c);
        }
        if (local_4f9 != false) {
          local_28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT17(in_stack_fffffffffffffaf7,
                                              CONCAT16(in_stack_fffffffffffffaf6,
                                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                                         in_stack_fffffffffffffaf0))
                                                      )),
                                  (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          local_20 = local_258;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = local_258;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     in_stack_fffffffffffffae8);
          local_8 = local_258;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffb10,(self_type *)in_RDI);
          in_stack_fffffffffffffaf8 =
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffffaf7,
                                           CONCAT16(in_stack_fffffffffffffaf6,
                                                    CONCAT15(in_stack_fffffffffffffaf5,
                                                             CONCAT14(in_stack_fffffffffffffaf4,
                                                                      in_stack_fffffffffffffaf0)))),
                               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          local_50 = local_2d8;
          local_58 = local_1a8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_59,local_1a8);
          local_40 = local_2d8;
          local_48 = local_58;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     in_stack_fffffffffffffae8);
          local_38 = local_2d8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))));
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffae8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x7b61d7);
          if (tVar2) {
            local_88 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT17(in_stack_fffffffffffffaf7,
                                                CONCAT16(in_stack_fffffffffffffaf6,
                                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                                  CONCAT14(in_stack_fffffffffffffaf4
                                                                           ,
                                                  in_stack_fffffffffffffaf0)))),
                                    (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
            local_80 = local_358;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_89,local_88);
            local_70 = local_358;
            local_78 = local_88;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       in_stack_fffffffffffffae8);
            local_68 = local_358;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))));
            local_178 = local_1a8;
            local_180 = local_358;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       in_stack_fffffffffffffae8);
          }
        }
        in_stack_fffffffffffffaf7 = false;
        if ((local_1d0 != ON_LOWER) && (in_stack_fffffffffffffaf7 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(ulong)CONCAT16(in_stack_fffffffffffffaf6,
                                          CONCAT15(in_stack_fffffffffffffaf5,
                                                   CONCAT14(in_stack_fffffffffffffaf4,
                                                            in_stack_fffffffffffffaf0))),
                       (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          local_360 = 0;
          in_stack_fffffffffffffaf7 =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffae8,(double *)0x7b62fa);
        }
        if ((type_conflict5)in_stack_fffffffffffffaf7 != false) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffaf7,
                                   CONCAT16(in_stack_fffffffffffffaf6,
                                            CONCAT15(in_stack_fffffffffffffaf5,
                                                     CONCAT14(in_stack_fffffffffffffaf4,
                                                              in_stack_fffffffffffffaf0)))),
                       (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffb10,(self_type *)in_RDI);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffaf7,
                                   CONCAT16(in_stack_fffffffffffffaf6,
                                            CONCAT15(in_stack_fffffffffffffaf5,
                                                     CONCAT14(in_stack_fffffffffffffaf4,
                                                              in_stack_fffffffffffffaf0)))),
                       (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffae8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x7b6353);
          if (tVar2) {
            local_160 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffffaf7,
                                                 CONCAT16(in_stack_fffffffffffffaf6,
                                                          CONCAT15(in_stack_fffffffffffffaf5,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffaf4,
                                                  in_stack_fffffffffffffaf0)))),
                                     (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
            local_158 = local_1a8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       in_stack_fffffffffffffae8);
          }
        }
      }
      else {
        in_stack_fffffffffffffaf6 = false;
        if ((local_1d0 != ON_UPPER) && (in_stack_fffffffffffffaf6 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffaf7,
                                   (uint7)CONCAT15(in_stack_fffffffffffffaf5,
                                                   CONCAT14(in_stack_fffffffffffffaf4,
                                                            in_stack_fffffffffffffaf0))),n);
          local_368 = 0;
          in_stack_fffffffffffffaf6 =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffae8,(double *)0x7b63f1);
        }
        if ((type_conflict5)in_stack_fffffffffffffaf6 != false) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffaf7,
                                   CONCAT16(in_stack_fffffffffffffaf6,
                                            CONCAT15(in_stack_fffffffffffffaf5,
                                                     CONCAT14(in_stack_fffffffffffffaf4,
                                                              in_stack_fffffffffffffaf0)))),
                       (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffb10,(self_type *)in_RDI);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffaf7,
                                   CONCAT16(in_stack_fffffffffffffaf6,
                                            CONCAT15(in_stack_fffffffffffffaf5,
                                                     CONCAT14(in_stack_fffffffffffffaf4,
                                                              in_stack_fffffffffffffaf0)))),
                       (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffae8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x7b644a);
          if (tVar2) {
            local_170 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffffaf7,
                                                 CONCAT16(in_stack_fffffffffffffaf6,
                                                          CONCAT15(in_stack_fffffffffffffaf5,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffaf4,
                                                  in_stack_fffffffffffffaf0)))),
                                     (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
            local_168 = local_1a8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       in_stack_fffffffffffffae8);
          }
        }
        in_stack_fffffffffffffaf5 = false;
        if ((local_1d0 != ON_LOWER) && (in_stack_fffffffffffffaf5 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffaf7,
                                   CONCAT16(in_stack_fffffffffffffaf6,
                                            (uint6)CONCAT14(in_stack_fffffffffffffaf4,
                                                            in_stack_fffffffffffffaf0))),
                       (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          local_370 = 0;
          in_stack_fffffffffffffaf5 =
               boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffae8,(double *)0x7b64e3);
        }
        if ((type_conflict5)in_stack_fffffffffffffaf5 != false) {
          local_b8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT17(in_stack_fffffffffffffaf7,
                                              CONCAT16(in_stack_fffffffffffffaf6,
                                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                                         in_stack_fffffffffffffaf0))
                                                      )),
                                  (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          local_b0 = local_3f0;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b9,local_b8);
          local_a0 = local_3f0;
          local_a8 = local_b8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     in_stack_fffffffffffffae8);
          iVar3 = (int)((ulong)in_stack_fffffffffffffae8 >> 0x20);
          local_98 = local_3f0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffb10,(self_type *)in_RDI);
          in_stack_fffffffffffffae8 =
               &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT17(in_stack_fffffffffffffaf7,
                                         CONCAT16(in_stack_fffffffffffffaf6,
                                                  CONCAT15(in_stack_fffffffffffffaf5,
                                                           CONCAT14(in_stack_fffffffffffffaf4,
                                                                    in_stack_fffffffffffffaf0)))),
                             iVar3)->m_backend;
          local_e0 = local_470;
          local_e8 = local_1a8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_e9,local_1a8);
          local_d0 = local_470;
          local_d8 = local_e8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))),
                     in_stack_fffffffffffffae8);
          local_c8 = local_470;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffaf7,
                              CONCAT16(in_stack_fffffffffffffaf6,
                                       CONCAT15(in_stack_fffffffffffffaf5,
                                                CONCAT14(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0)))));
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffae8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x7b664c);
          if (tVar2) {
            local_118 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffffaf7,
                                                 CONCAT16(in_stack_fffffffffffffaf6,
                                                          CONCAT15(in_stack_fffffffffffffaf5,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffaf4,
                                                  in_stack_fffffffffffffaf0)))),
                                     (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
            local_110 = &stack0xfffffffffffffb10;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_119,local_118);
            local_100 = &stack0xfffffffffffffb10;
            local_108 = local_118;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       in_stack_fffffffffffffae8);
            local_f8 = &stack0xfffffffffffffb10;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))));
            local_188 = local_1a8;
            local_190 = &stack0xfffffffffffffb10;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,
                                         CONCAT15(in_stack_fffffffffffffaf5,
                                                  CONCAT14(in_stack_fffffffffffffaf4,
                                                           in_stack_fffffffffffffaf0)))),
                       in_stack_fffffffffffffae8);
          }
        }
      }
    }
    local_191 = true;
  }
  else {
    local_191 = false;
  }
  return local_191;
}

Assistant:

bool SoPlexBase<R>::getDualViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& dual = _solReal._dual;
   assert(dual.dim() == numRows());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int r = numRows() - 1; r >= 0; r--)
   {
      typename SPxSolverBase<R>::VarStatus rowStatus = basisRowStatus(r);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }
      }
      else
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }
      }
   }

   return true;
}